

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * ResolveInitializerValue(ExpressionContext *ctx,SynBase *source,ExprBase *initializer)

{
  int iVar1;
  FunctionData *function_00;
  char *errorBuf;
  ArrayView<FunctionValue> functions_00;
  char *messageStart_00;
  bool bVar2;
  uint uVar3;
  TypeBase *pTVar4;
  bool_type bVar5;
  ExprFunctionOverloadSet *pEVar6;
  ExprError *this;
  ExprBase *arg1;
  TypeFunction *pTVar7;
  size_t sVar8;
  ArrayView<FunctionValue> local_3b0;
  char *local_3a0;
  char *messageStart;
  undefined1 local_388 [8];
  SmallArray<FunctionValue,_32U> functions;
  ExprBase *table;
  FunctionData *function;
  ExprFunctionOverloadSet *node;
  FunctionValue bestOverload;
  TypeFunction *target;
  ExprBase *initializer_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  if (initializer == (ExprBase *)0x0) {
    anon_unknown.dwarf_e7629::Report
              (ctx,source,"ERROR: auto variable must be initialized in place of definition");
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)ctx_local,source,pTVar4);
  }
  else if (initializer->type == ctx->typeVoid) {
    anon_unknown.dwarf_e7629::Report(ctx,source,"ERROR: r-value type is \'void\'");
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
    pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    ExprError::ExprError((ExprError *)ctx_local,source,pTVar4);
  }
  else {
    bestOverload.context = (ExprBase *)getType<TypeFunction>(initializer->type);
    target = (TypeFunction *)initializer;
    if ((TypeFunction *)bestOverload.context != (TypeFunction *)0x0) {
      GetFunctionForType((FunctionValue *)&node,ctx,initializer->source,initializer,
                         (TypeFunction *)bestOverload.context);
      bVar5 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)&node);
      if (bVar5 != 0) {
        target = (TypeFunction *)ExpressionContext::get<ExprFunctionAccess>(ctx);
        ExprFunctionAccess::ExprFunctionAccess
                  ((ExprFunctionAccess *)target,(SynBase *)node,
                   (TypeBase *)((bestOverload.source)->pos).end,(FunctionData *)bestOverload.source,
                   (ExprBase *)bestOverload.function);
      }
    }
    pEVar6 = getType<ExprFunctionOverloadSet>((ExprBase *)target);
    if (pEVar6 != (ExprFunctionOverloadSet *)0x0) {
      uVar3 = IntrusiveList<FunctionHandle>::size(&pEVar6->functions);
      if (uVar3 != 1) {
        SmallArray<FunctionValue,_32U>::SmallArray
                  ((SmallArray<FunctionValue,_32U> *)local_388,ctx->allocator);
        GetNodeFunctions(ctx,(SynBase *)(target->super_TypeBase).name.begin,(ExprBase *)target,
                         (SmallArray<FunctionValue,_32U> *)local_388);
        if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = ctx->errorBuf;
          }
          local_3a0 = ctx->errorBufLocation;
          NULLC::SafeSprintf(ctx->errorBufLocation,
                             (ulong)(ctx->errorBufSize +
                                    (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation)),
                             "ERROR: ambiguity, there is more than one overloaded function available:\n"
                            );
          sVar8 = strlen(ctx->errorBufLocation);
          messageStart_00 = local_3a0;
          ctx->errorBufLocation = ctx->errorBufLocation + sVar8;
          errorBuf = ctx->errorBufLocation;
          iVar1 = *(int *)&ctx->errorBuf;
          uVar3 = ctx->errorBufSize;
          ArrayView<FunctionValue>::ArrayView<32u>
                    (&local_3b0,(SmallArray<FunctionValue,_32U> *)local_388);
          functions_00.count = local_3b0.count;
          functions_00.data = local_3b0.data;
          functions_00._12_4_ = local_3b0._12_4_;
          ReportOnFunctionSelectError
                    (ctx,source,errorBuf,uVar3 + (iVar1 - (int)errorBuf),messageStart_00,
                     functions_00);
          sVar8 = strlen(ctx->errorBufLocation);
          ctx->errorBufLocation = ctx->errorBufLocation + sVar8;
        }
        if ((ctx->errorHandlerActive & 1U) != 0) {
          longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
        }
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x20e0,
                      "ExprBase *ResolveInitializerValue(ExpressionContext &, SynBase *, ExprBase *)"
                     );
      }
      function_00 = ((pEVar6->functions).head)->function;
      if (function_00->type->returnType == ctx->typeAuto) {
        anon_unknown.dwarf_e7629::Report
                  (ctx,source,"ERROR: function type is unresolved at this point");
        this = ExpressionContext::get<ExprError>(ctx);
        pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprError::ExprError(this,source,pTVar4);
        return &this->super_ExprBase;
      }
      bVar2 = IsVirtualFunctionCall(ctx,function_00,pEVar6->context->type);
      if (bVar2) {
        arg1 = GetFunctionTable(ctx,source,function_00);
        InplaceStr::InplaceStr((InplaceStr *)&functions.allocator,"__redirect_ptr");
        pTVar7 = (TypeFunction *)
                 CreateFunctionCall2(ctx,source,stack0xffffffffffffff90,pEVar6->context,arg1,false,
                                     true,true);
        bVar2 = isType<TypeError>((ExprBase *)pTVar7);
        target = pTVar7;
        if (!bVar2) {
          target = (TypeFunction *)ExpressionContext::get<ExprTypeCast>(ctx);
          ExprTypeCast::ExprTypeCast
                    ((ExprTypeCast *)target,source,&function_00->type->super_TypeBase,
                     (ExprBase *)pTVar7,EXPR_CAST_REINTERPRET);
        }
      }
      else {
        pTVar7 = (TypeFunction *)ExpressionContext::get<ExprFunctionAccess>(ctx);
        ExprFunctionAccess::ExprFunctionAccess
                  ((ExprFunctionAccess *)pTVar7,(SynBase *)(target->super_TypeBase).name.begin,
                   &function_00->type->super_TypeBase,function_00,pEVar6->context);
        target = pTVar7;
      }
    }
    bVar2 = isType<ExprGenericFunctionPrototype>((ExprBase *)target);
    if ((bVar2) || (((target->super_TypeBase).name.end[0x3c] & 1U) != 0)) {
      anon_unknown.dwarf_e7629::Stop
                (ctx,source,
                 "ERROR: cannot instantiate generic function, because target type is not known");
    }
    bVar2 = isType<ExprUnboxing>((ExprBase *)target);
    if (bVar2) {
      anon_unknown.dwarf_e7629::Report
                (ctx,source,"ERROR: target type of an \'auto ref\' cast is unknown");
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprError>(ctx);
      pTVar4 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      ExprError::ExprError((ExprError *)ctx_local,source,pTVar4);
    }
    else {
      ctx_local = (ExpressionContext *)target;
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* ResolveInitializerValue(ExpressionContext &ctx, SynBase *source, ExprBase *initializer)
{
	if(!initializer)
	{
		Report(ctx, source, "ERROR: auto variable must be initialized in place of definition");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(initializer->type == ctx.typeVoid)
	{
		Report(ctx, source, "ERROR: r-value type is 'void'");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(TypeFunction *target = getType<TypeFunction>(initializer->type))
	{
		if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
			initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
	}

	if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(initializer))
	{
		if(node->functions.size() == 1)
		{
			FunctionData *function = node->functions.head->function;

			if(function->type->returnType == ctx.typeAuto)
			{
				Report(ctx, source, "ERROR: function type is unresolved at this point");

				return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}

			if(IsVirtualFunctionCall(ctx, function, node->context->type))
			{
				ExprBase *table = GetFunctionTable(ctx, source, function);

				initializer = CreateFunctionCall2(ctx, source, InplaceStr("__redirect_ptr"), node->context, table, false, true, true);

				if(!isType<TypeError>(initializer))
					initializer = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, initializer, EXPR_CAST_REINTERPRET);
			}
			else
			{
				initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(initializer->source, function->type, function, node->context);
			}
		}
		else
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, initializer->source, initializer, functions);

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available:\n");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(isType<ExprGenericFunctionPrototype>(initializer) || initializer->type->isGeneric)
		Stop(ctx, source, "ERROR: cannot instantiate generic function, because target type is not known");

	if(isType<ExprUnboxing>(initializer))
	{
		Report(ctx, source, "ERROR: target type of an 'auto ref' cast is unknown");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	return initializer;
}